

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O2

void __thiscall Hydro::MacProjector::project(MacProjector *this,Real reltol,Real atol)

{
  pointer paVar1;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> vel_eb;
  MLMG *pMVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX_00;
  Geometry *geom;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *extraout_RDX_01;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a_00;
  MultiFab *pMVar7;
  int ilev;
  ulong uVar8;
  FabArray<amrex::FArrayBox> *this_00;
  int idim;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Real RVar12;
  Array<const_MultiFab_*,_3> u;
  _Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_58;
  Real local_40;
  Real local_38;
  
  lVar4 = (long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = lVar4 / 0x180;
  a = (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)(lVar4 % 0x180);
  uVar8 = 0;
  uVar9 = uVar5 & 0xffffffff;
  local_40 = reltol;
  local_38 = atol;
  if ((int)uVar5 < 1) {
    uVar9 = uVar8;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    if ((this->m_needs_level_bcs).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar8] != 0) {
      (*this->m_linop->_vptr_MLLinOp[3])(this->m_linop,uVar8 & 0xffffffff,0,0,0);
      (this->m_needs_level_bcs).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar8]
           = 0;
      a = extraout_RDX;
    }
  }
  if (((this->m_umac).
       super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       .
       super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0] != (MultiFab *)0x0) {
    averageDownVelocity(this);
    a = extraout_RDX_00;
  }
  lVar4 = 0;
  for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
    paVar1 = (this->m_umac).
             super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (paVar1->_M_elems[0] != (MultiFab *)0x0) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        u._M_elems[lVar6] = *(MultiFab **)((long)paVar1->_M_elems + lVar6 * 8 + lVar4);
      }
      if (this->m_umac_loc != FaceCentroid) {
        lVar6 = 3;
        lVar10 = lVar4;
        while (bVar3 = lVar6 != 0, lVar6 = lVar6 + -1, bVar3) {
          this_00 = *(FabArray<amrex::FArrayBox> **)
                     ((long)((this->m_umac).
                             super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                             .
                             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar10);
          if ((this_00->super_FabArrayBase).n_grow.vect[0] < 1) {
            amrex::Assert_host("m_umac[ilev][idim]->nGrow() > 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                               ,0xf6,
                               "\"MacProjector: with EB, umac must have at least one ghost cell if not already_on_centroid\""
                              );
            this_00 = *(FabArray<amrex::FArrayBox> **)
                       ((long)((this->m_umac).
                               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                               .
                               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar10);
          }
          local_58._M_impl.super__Vector_impl_data._0_12_ =
               amrex::Geometry::periodicity
                         ((this->m_geom).
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar5);
          amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_00,(Periodicity *)&local_58,false);
          lVar10 = lVar10 + 8;
        }
      }
      vel_eb.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
            &(this->m_eb_vel).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      pMVar7 = (this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      geom = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5;
      if (vel_eb.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
          (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
        amrex::EB_computeDivergence(pMVar7,&u,geom,this->m_umac_loc == FaceCentroid);
      }
      else {
        amrex::EB_computeDivergence
                  (pMVar7,&u,geom,this->m_umac_loc == FaceCentroid,
                   (MultiFab *)
                   vel_eb.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
      }
      RVar12 = -1.0;
      if ((this->m_poisson)._M_t.
          super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
          super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
        RVar12 = 1.0 / this->m_const_beta;
      }
      amrex::MultiFab::mult
                ((this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5,RVar12,0);
    }
    bVar3 = amrex::FabArray<amrex::FArrayBox>::ok
                      (&(this->m_divu).
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar5].
                        super_FabArray<amrex::FArrayBox>);
    if (bVar3) {
      RVar12 = 1.0;
      if ((this->m_poisson)._M_t.
          super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
          super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
        RVar12 = -1.0 / this->m_const_beta;
      }
      amrex::MultiFab::Saxpy
                ((this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5,RVar12,
                 (this->m_divu).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5,0,0,1,0);
    }
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5].super_FabArray<amrex::FArrayBox>,0.0);
    lVar4 = lVar4 + 0x18;
    a = extraout_RDX_01;
  }
  pMVar2 = (this->m_mlmg)._M_t.super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>
           ._M_t.super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
           super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
  amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&u,
             (amrex *)&this->m_phi,a);
  amrex::GetVecOfConstPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_58,
             (amrex *)&this->m_rhs,a_00);
  amrex::MLMG::solve(pMVar2,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&u,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_58,local_40,local_38,(char *)0x0);
  std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
  ~_Vector_base(&local_58);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&u);
  if (((this->m_umac).
       super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       .
       super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0] != (MultiFab *)0x0) {
    pMVar2 = (this->m_mlmg)._M_t.
             super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
             super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl;
    amrex::GetVecOfArrOfPtrs<amrex::MultiFab,_0>
              ((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)&u,&this->m_fluxes);
    amrex::MLMG::getFluxes
              (pMVar2,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                       *)&u,this->m_umac_loc);
    std::
    _Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                     *)&u);
    lVar6 = 0;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      lVar10 = lVar4;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pMVar7 = *(MultiFab **)
                  ((long)((this->m_umac).
                          super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11 * 8 + lVar6)
        ;
        if ((this->m_poisson)._M_t.
            super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
            super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl == (MLPoisson *)0x0) {
          amrex::MultiFab::Add
                    (pMVar7,(MultiFab *)
                            ((long)&((this->m_fluxes).
                                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                     .
                                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                                    super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                    _vptr_FabArrayBase + lVar10),0,0,1,0);
        }
        else {
          amrex::MultiFab::Saxpy
                    (pMVar7,this->m_const_beta,
                     (MultiFab *)
                     ((long)&((this->m_fluxes).
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].
                             super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                     + lVar10),0,0,1,0);
        }
        amrex::EB_set_covered_faces
                  ((this->m_umac).
                   super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   .
                   super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar5,0.0);
        lVar10 = lVar10 + 0x180;
      }
      lVar4 = lVar4 + 0x480;
      lVar6 = lVar6 + 0x18;
    }
    averageDownVelocity(this);
  }
  return;
}

Assistant:

void
MacProjector::project (Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        if (m_needs_level_bcs[ilev]) {
            m_linop->setLevelBC(ilev, nullptr);
            m_needs_level_bcs[ilev] = false;
        }
    }

    if ( m_umac[0][0] )
      averageDownVelocity();

    for (int ilev = 0; ilev < nlevs; ++ilev)
    {
      if ( m_umac[0][0] )
      {
        Array<MultiFab const*, AMREX_SPACEDIM> u;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            u[idim] = m_umac[ilev][idim];
        }
#ifdef AMREX_USE_EB
        if (m_umac_loc != MLMG::Location::FaceCentroid)
        {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_umac[ilev][idim]->nGrow() > 0,
                                                 "MacProjector: with EB, umac must have at least one ghost cell if not already_on_centroid");
                m_umac[ilev][idim]->FillBoundary(m_geom[ilev].periodicity());
            }
        }

        if (m_eb_vel[ilev]) {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid), *m_eb_vel[ilev]);
        } else {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid));
        }
#else
        computeDivergence(m_rhs[ilev], u, m_geom[ilev]);
#endif

        // For mlabeclaplacian, we solve -del dot (beta grad phi) = rhs
        //   and set up RHS as (m_divu - divu), where m_divu is a user-provided source term
        // For mlpoisson, we solve `del dot grad phi = rhs/(-const_beta)`
        //   and set up RHS as (m_divu - divu)*(-1/const_beta)
        AMREX_ASSERT(m_poisson == nullptr || m_const_beta != Real(0.0));
        m_rhs[ilev].mult(m_poisson ? Real(1.0)/m_const_beta : Real(-1.0));
      }
      //else m_rhs already initialized to 0

      if (m_divu[ilev].ok())
      {
        MultiFab::Saxpy(m_rhs[ilev], m_poisson ? Real(-1.0)/m_const_beta : Real(1.0),
                        m_divu[ilev], 0, 0, 1, 0);
      }

      // Always reset initial phi to be zero. This is needed to handle the
      // situation where the MacProjector is being reused.
      m_phi[ilev].setVal(0.0);
    }

    m_mlmg->solve(amrex::GetVecOfPtrs(m_phi), amrex::GetVecOfConstPtrs(m_rhs), reltol, atol);

    if ( m_umac[0][0] )
    {
      m_mlmg->getFluxes(amrex::GetVecOfArrOfPtrs(m_fluxes), m_umac_loc);

      for (int ilev = 0; ilev < nlevs; ++ilev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (m_poisson) {
                MultiFab::Saxpy(*m_umac[ilev][idim], m_const_beta, m_fluxes[ilev][idim], 0,0,1,0);
            } else {
                MultiFab::Add(*m_umac[ilev][idim], m_fluxes[ilev][idim], 0, 0, 1, 0);
            }
#ifdef AMREX_USE_EB
            EB_set_covered_faces(m_umac[ilev], 0.0);
#endif
        }
      }

      averageDownVelocity();
    }

}